

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O2

int tcu::measurePixelDiffAccuracy
              (TestLog *log,char *imageSetName,char *imageSetDesc,ConstPixelBufferAccess *reference,
              ConstPixelBufferAccess *result,int bestScoreDiff,int worstScoreDiff,
              CompareLogMode logMode)

{
  TestLog *this;
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  InternalError *this_00;
  int iVar6;
  int iVar7;
  int iVar8;
  Vec4 *bias;
  ConstPixelBufferAccess *__n;
  ConstPixelBufferAccess *pCVar9;
  string *unit;
  void *__buf;
  void *__buf_00;
  void *__buf_01;
  void *__buf_02;
  void *__buf_03;
  void *__buf_04;
  void *__buf_05;
  void *__buf_06;
  uint uVar10;
  ulong value;
  int x;
  int y;
  long value_00;
  float fVar11;
  allocator<char> local_3d1;
  ConstPixelBufferAccess *local_3d0;
  allocator<char> local_3c3;
  allocator<char> local_3c2;
  allocator<char> local_3c1;
  allocator<char> local_3c0;
  allocator<char> local_3bf;
  allocator<char> local_3be;
  allocator<char> local_3bd;
  int local_3bc;
  string local_3b8;
  Vec4 local_398;
  Vec4 local_388;
  char *local_378;
  char *local_370;
  TestLog *local_368;
  ConstPixelBufferAccess *local_360;
  ConstPixelBufferAccess local_358;
  string local_330;
  string local_310;
  IVec4 diff;
  string local_2a8;
  string local_288;
  string local_268;
  string local_248;
  string local_228;
  LogImage local_208;
  TextureLevel diffMask;
  IVec4 b;
  IVec4 a;
  
  local_208.m_name._M_dataplus._M_p = (pointer)0x300000007;
  local_3d0 = result;
  local_3bc = bestScoreDiff;
  local_378 = imageSetDesc;
  local_370 = imageSetName;
  TextureLevel::TextureLevel
            (&diffMask,(TextureFormat *)&local_208,(reference->m_size).m_data[0],
             (reference->m_size).m_data[1],1);
  TextureLevel::getAccess((PixelBufferAccess *)&local_208,&diffMask);
  local_368 = log;
  if (((reference->m_format).type != UNORM_INT8) || ((local_3d0->m_format).type != UNORM_INT8)) {
    this_00 = (InternalError *)__cxa_allocate_exception(0x38);
    InternalError::InternalError
              (this_00,(char *)0x0,
               "ref.getFormat().type == TextureFormat::UNORM_INT8 && cmp.getFormat().type == TextureFormat::UNORM_INT8"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/common/tcuImageCompare.cpp"
               ,0x125);
    __cxa_throw(this_00,&InternalError::typeinfo,Exception::~Exception);
  }
  value_00 = 0;
  local_360 = reference;
  for (iVar8 = 0; pCVar9 = local_360, iVar8 < (local_3d0->m_size).m_data[1]; iVar8 = iVar8 + 1) {
    for (y = 0; y < (local_3d0->m_size).m_data[0]; y = y + 1) {
      ConstPixelBufferAccess::getPixelInt((ConstPixelBufferAccess *)&a,(int)local_360,y,iVar8);
      ConstPixelBufferAccess::getPixelInt((ConstPixelBufferAccess *)&b,(int)local_3d0,y,iVar8);
      operator-((tcu *)&local_358,&a,&b);
      abs<int,4>((tcu *)&diff,(Vector<int,_4> *)&local_358);
      iVar4 = diff.m_data[3];
      iVar3 = diff.m_data[2];
      iVar2 = diff.m_data[1];
      iVar1 = diff.m_data[0];
      uVar5 = (diff.m_data[2] + diff.m_data[3] + diff.m_data[1] + diff.m_data[0]) * 8;
      iVar6 = uVar5 - 0xff;
      if (0xfe < (int)uVar5) {
        uVar5 = 0xff;
      }
      if ((int)uVar5 < 1) {
        uVar5 = 0;
      }
      iVar7 = -iVar6;
      if (0xfe < -iVar6) {
        iVar7 = 0xff;
      }
      if (iVar7 < 1) {
        iVar7 = 0;
      }
      local_3b8._M_dataplus._M_p._0_4_ = uVar5 | iVar7 << 8 | 0xff000000;
      RGBA::toVec((RGBA *)&local_3b8);
      PixelBufferAccess::setPixel((PixelBufferAccess *)&local_208,(Vec4 *)&local_358,y,iVar8,0);
      value_00 = value_00 + (iVar4 * iVar4 + iVar3 * iVar3 + iVar2 * iVar2 + iVar1 * iVar1);
    }
  }
  fVar11 = (float)value_00;
  if (fVar11 < 0.0) {
    fVar11 = sqrtf(fVar11);
  }
  else {
    fVar11 = SQRT(fVar11);
  }
  this = local_368;
  bias = (Vec4 *)(ulong)(uint)(worstScoreDiff - local_3bc);
  fVar11 = floorf(100.0 - ((float)(-(uint)(0.0 <= fVar11 - (float)local_3bc) &
                                  (uint)(fVar11 - (float)local_3bc)) /
                          (float)(worstScoreDiff - local_3bc)) * 100.0);
  uVar10 = (uint)fVar11;
  uVar5 = 100;
  if ((int)uVar10 < 100) {
    uVar5 = uVar10;
  }
  value = 0;
  if (0 < (int)uVar5) {
    value = (ulong)uVar5;
  }
  local_388.m_data[0] = 0.0;
  local_388.m_data[1] = 0.0;
  local_388.m_data[2] = 0.0;
  local_388.m_data[3] = 0.0;
  local_398.m_data[0] = 1.0;
  local_398.m_data[1] = 1.0;
  local_398.m_data[2] = 1.0;
  local_398.m_data[3] = 1.0;
  iVar8 = (int)this;
  if ((logMode == COMPARE_LOG_EVERYTHING) || ((int)uVar10 < 0xb)) {
    if ((((local_3d0->m_format).order != RGBA) || ((local_3d0->m_format).type != UNORM_INT8)) &&
       (((pCVar9->m_format).order != RGBA || ((pCVar9->m_format).type != UNORM_INT8)))) {
      bias = &local_388;
      anon_unknown_50::computeScaleAndBias(pCVar9,local_3d0,&local_398,bias);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_3b8,local_370,&local_3d1);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_310,local_378,&local_3bd);
    LogImageSet::LogImageSet((LogImageSet *)&diff,&local_3b8,&local_310);
    LogImageSet::write((LogImageSet *)&diff,iVar8,__buf_01,(size_t)bias);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_330,"Result",&local_3be);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_288,"Result",&local_3bf);
    __n = local_3d0;
    LogImage::LogImage(&local_208,&local_330,&local_288,local_3d0,&local_398,&local_388,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write(&local_208,iVar8,__buf_02,(size_t)__n);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_2a8,"Reference",&local_3c0);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"Reference",&local_3c1);
    LogImage::LogImage((LogImage *)&a,&local_2a8,&local_228,pCVar9,&local_398,&local_388,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)&a,iVar8,__buf_03,(size_t)pCVar9);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_248,"DiffMask",&local_3c2);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"Difference",&local_3c3)
    ;
    ConstPixelBufferAccess::ConstPixelBufferAccess(&local_358,&diffMask);
    pCVar9 = &local_358;
    LogImage::LogImage((LogImage *)&b,&local_248,&local_268,pCVar9,QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write((LogImage *)&b,iVar8,__buf_04,(size_t)pCVar9);
    TestLog::endImageSet(this);
    LogImage::~LogImage((LogImage *)&b);
    std::__cxx11::string::~string((string *)&local_268);
    std::__cxx11::string::~string((string *)&local_248);
    LogImage::~LogImage((LogImage *)&a);
    std::__cxx11::string::~string((string *)&local_228);
    std::__cxx11::string::~string((string *)&local_2a8);
    LogImage::~LogImage(&local_208);
    std::__cxx11::string::~string((string *)&local_288);
    std::__cxx11::string::~string((string *)&local_330);
    LogImageSet::~LogImageSet((LogImageSet *)&diff);
    std::__cxx11::string::~string((string *)&local_310);
    std::__cxx11::string::~string((string *)&local_3b8);
LAB_015f8129:
    if ((logMode == COMPARE_LOG_ON_ERROR) && (10 < (int)uVar10)) goto LAB_015f82b2;
  }
  else {
    if (logMode != COMPARE_LOG_RESULT) goto LAB_015f8129;
    if (((local_3d0->m_format).order != RGBA) || ((local_3d0->m_format).type != UNORM_INT8)) {
      computePixelScaleBias(local_3d0,&local_398,&local_388);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&b,local_370,(allocator<char> *)&local_310);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&diff,local_378,(allocator<char> *)&local_330);
    LogImageSet::LogImageSet((LogImageSet *)&a,(string *)&b,(string *)&diff);
    LogImageSet::write((LogImageSet *)&a,iVar8,__buf,(size_t)bias);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_358,"Result",(allocator<char> *)&local_288);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_3b8,"Result",(allocator<char> *)&local_2a8);
    pCVar9 = local_3d0;
    LogImage::LogImage(&local_208,(string *)&local_358,&local_3b8,local_3d0,&local_398,&local_388,
                       QP_IMAGE_COMPRESSION_MODE_BEST);
    LogImage::write(&local_208,iVar8,__buf_00,(size_t)pCVar9);
    TestLog::endImageSet(this);
    LogImage::~LogImage(&local_208);
    std::__cxx11::string::~string((string *)&local_3b8);
    std::__cxx11::string::~string((string *)&local_358);
    LogImageSet::~LogImageSet((LogImageSet *)&a);
    std::__cxx11::string::~string((string *)&diff);
    std::__cxx11::string::~string((string *)&b);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&b,"DiffSum",(allocator<char> *)&local_288);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&diff,"Squared difference sum",(allocator<char> *)&local_2a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_358,glcts::fixed_sample_locations_values + 1,
             (allocator<char> *)&local_228);
  pCVar9 = &local_358;
  LogNumber<long>::LogNumber
            ((LogNumber<long> *)&local_208,(string *)&b,(string *)&diff,(string *)pCVar9,
             QP_KEY_TAG_NONE,value_00);
  LogNumber<long>::write((LogNumber<long> *)&local_208,iVar8,__buf_05,(size_t)pCVar9);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3b8,"Score",(allocator<char> *)&local_248);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_310,"Score",(allocator<char> *)&local_268);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_330,glcts::fixed_sample_locations_values + 1,&local_3d1);
  unit = &local_330;
  LogNumber<long>::LogNumber
            ((LogNumber<long> *)&a,&local_3b8,&local_310,unit,QP_KEY_TAG_QUALITY,value);
  LogNumber<long>::write((LogNumber<long> *)&a,iVar8,__buf_06,(size_t)unit);
  LogNumber<long>::~LogNumber((LogNumber<long> *)&a);
  std::__cxx11::string::~string((string *)&local_330);
  std::__cxx11::string::~string((string *)&local_310);
  std::__cxx11::string::~string((string *)&local_3b8);
  LogNumber<long>::~LogNumber((LogNumber<long> *)&local_208);
  std::__cxx11::string::~string((string *)&local_358);
  std::__cxx11::string::~string((string *)&diff);
  std::__cxx11::string::~string((string *)&b);
LAB_015f82b2:
  TextureLevel::~TextureLevel(&diffMask);
  return (int)value;
}

Assistant:

int measurePixelDiffAccuracy (TestLog& log, const char* imageSetName, const char* imageSetDesc, const ConstPixelBufferAccess& reference, const ConstPixelBufferAccess& result, int bestScoreDiff, int worstScoreDiff, CompareLogMode logMode)
{
	TextureLevel	diffMask		(TextureFormat(TextureFormat::RGB, TextureFormat::UNORM_INT8), reference.getWidth(), reference.getHeight());
	int				diffFactor		= 8;
	deInt64			squaredSum		= computeSquaredDiffSum(reference, result, diffMask.getAccess(), diffFactor);
	float			sum				= deFloatSqrt((float)squaredSum);
	int				score			= deClamp32(deFloorFloatToInt32(100.0f - (de::max(sum-(float)bestScoreDiff, 0.0f) / (float)(worstScoreDiff-bestScoreDiff))*100.0f), 0, 100);
	const int		failThreshold	= 10;
	Vec4			pixelBias		(0.0f, 0.0f, 0.0f, 0.0f);
	Vec4			pixelScale		(1.0f, 1.0f, 1.0f, 1.0f);

	if (logMode == COMPARE_LOG_EVERYTHING || score <= failThreshold)
	{
		if (result.getFormat() != TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8) && reference.getFormat() != TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8))
			computeScaleAndBias(reference, result, pixelScale, pixelBias);

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",			result,		pixelScale, pixelBias)
			<< TestLog::Image("Reference",	"Reference",		reference,	pixelScale, pixelBias)
			<< TestLog::Image("DiffMask",	"Difference",		diffMask)
			<< TestLog::EndImageSet;
	}
	else if (logMode == COMPARE_LOG_RESULT)
	{
		if (result.getFormat() != TextureFormat(TextureFormat::RGBA, TextureFormat::UNORM_INT8))
			computePixelScaleBias(result, pixelScale, pixelBias);

		log << TestLog::ImageSet(imageSetName, imageSetDesc)
			<< TestLog::Image("Result",		"Result",			result,		pixelScale, pixelBias)
			<< TestLog::EndImageSet;
	}

	if (logMode != COMPARE_LOG_ON_ERROR || score <= failThreshold)
		log << TestLog::Integer("DiffSum", "Squared difference sum", "", QP_KEY_TAG_NONE, squaredSum)
			<< TestLog::Integer("Score", "Score", "", QP_KEY_TAG_QUALITY, score);

	return score;
}